

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O1

void __thiscall event_track::DASHEventMessageBoxv1::print(DASHEventMessageBoxv1 *this)

{
  uchar *bytes_to_encode;
  ostream *poVar1;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"== Event Message instance Box emsg v1 ==",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," reserved (timescale) ",0x16);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," presentation_time: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," event_duration: ",0x11)
  ;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," id: ",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," scheme id uri: ",0x10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->scheme_id_uri_)._M_dataplus._M_p,
                      (this->scheme_id_uri_)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," value:  ",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->value_)._M_dataplus._M_p,
                      (this->value_)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," message data b64: ",0x13);
  bytes_to_encode =
       (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  base64_encode_abi_cxx11_
            (&local_38,bytes_to_encode,
             (long)(this->message_data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)bytes_to_encode);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void print()
		{
			std::cout << "== Event Message instance Box emsg v1 ==" << std::endl;
			std::cout << " reserved (timescale) " << timescale_ << std::endl;
			std::cout << " presentation_time: " << presentation_time_ << std::endl;
			std::cout << " event_duration: " << event_duration_ << std::endl;
			std::cout << " id: " << id_ << std::endl;
			std::cout << " scheme id uri: " << scheme_id_uri_ << std::endl;
			std::cout << " value:  " << value_ << std::endl;
			std::cout << " message data b64: " << base64_encode(message_data_.data(), message_data_.size()) << std::endl;
		}